

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void get_range<double>(double *x,size_t n,MissingAction missing_action,double *xmin,double *xmax,
                      bool *unsplittable)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  double *in_RCX;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  double *in_R8;
  byte *in_R9;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t row_1;
  size_t row;
  byte local_51;
  double local_50;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  *in_RCX = INFINITY;
  *in_R8 = -INFINITY;
  if (in_EDX == 0) {
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      if (*in_RCX <= *(double *)(in_RDI + local_38 * 8)) {
        local_48 = *in_RCX;
      }
      else {
        local_48 = *(double *)(in_RDI + local_38 * 8);
      }
      *in_RCX = local_48;
      dVar1 = *(double *)(in_RDI + local_38 * 8);
      if (dVar1 < *in_R8 || dVar1 == *in_R8) {
        local_50 = *in_R8;
      }
      else {
        local_50 = *(double *)(in_RDI + local_38 * 8);
      }
      *in_R8 = local_50;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_RSI; local_40 = local_40 + 1) {
      dVar1 = *in_RCX;
      dVar2 = *(double *)(in_RDI + local_40 * 8);
      uVar5 = SUB84(dVar2,0);
      uVar6 = (int)((ulong)dVar2 >> 0x20);
      if (dVar1 <= dVar2) {
        uVar5 = SUB84(dVar1,0);
        uVar6 = (int)((ulong)dVar1 >> 0x20);
      }
      *in_RCX = (double)(~-(ulong)NAN(dVar1) & CONCAT44(uVar6,uVar5) |
                        -(ulong)NAN(dVar1) & (ulong)dVar2);
      dVar1 = *in_R8;
      dVar2 = *(double *)(in_RDI + local_40 * 8);
      uVar5 = SUB84(dVar2,0);
      uVar6 = (int)((ulong)dVar2 >> 0x20);
      if (dVar2 <= dVar1) {
        uVar5 = SUB84(dVar1,0);
        uVar6 = (int)((ulong)dVar1 >> 0x20);
      }
      *in_R8 = (double)(~-(ulong)NAN(dVar1) & CONCAT44(uVar6,uVar5) |
                       -(ulong)NAN(dVar1) & (ulong)dVar2);
    }
  }
  local_51 = 1;
  if ((*in_RCX != *in_R8) || (NAN(*in_RCX) || NAN(*in_R8))) {
    if ((*in_RCX == INFINITY) && (!NAN(*in_RCX))) {
      local_51 = 1;
      if ((*in_R8 == -INFINITY) && (!NAN(*in_R8))) goto LAB_001dd9b2;
    }
    uVar3 = std::isnan(*in_RCX);
    local_51 = 1;
    if ((uVar3 & 1) == 0) {
      iVar4 = std::isnan(*in_R8);
      local_51 = (byte)iVar4;
    }
  }
LAB_001dd9b2:
  *in_R9 = local_51 & 1;
  return;
}

Assistant:

void get_range(real_t *restrict x, size_t n,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if (missing_action == Fail)
    {
        for (size_t row = 0; row < n; row++)
        {
            xmin = (x[row] < xmin)? x[row] : xmin;
            xmax = (x[row] > xmax)? x[row] : xmax;
        }
    }


    else
    {
        for (size_t row = 0; row < n; row++)
        {
            xmin = std::fmin(xmin, x[row]);
            xmax = std::fmax(xmax, x[row]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}